

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfCloseInputFile(ImfInputFile *in)

{
  RgbaInputFile *pRVar1;
  ImfInputFile *in_RDI;
  exception *e;
  
  pRVar1 = anon_unknown.dwarf_572a3::infile(in_RDI);
  if (pRVar1 != (RgbaInputFile *)0x0) {
    (*pRVar1->_vptr_RgbaInputFile[1])();
  }
  return 1;
}

Assistant:

int
ImfCloseInputFile (ImfInputFile* in)
{
    try
    {
        delete infile (in);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}